

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O2

void __thiscall Lodtalk::StackInterpreter::fetchFrameData(StackInterpreter *this)

{
  uint8_t *puVar1;
  ulong uVar2;
  CompiledMethod *pCVar3;
  Oop *pOVar4;
  
  puVar1 = (this->stack->stackFrame).framePointer;
  if (puVar1 != (uint8_t *)0x0) {
    uVar2 = *(ulong *)(puVar1 + -0x10);
    this->argumentCount = uVar2 & 0xff;
    this->isBlock = (uVar2 & 0xff00) != 0;
    this->hasContext = (uVar2 & 0xff0000) != 0;
    pCVar3 = *(CompiledMethod **)(puVar1 + -8);
    this->method = pCVar3;
    pOVar4 = (Oop *)(pCVar3 + 2);
    if (pCVar3 == (CompiledMethod *)0x0) {
      pOVar4 = (Oop *)0x0;
    }
    this->literalArray = pOVar4;
    return;
  }
  abort();
}

Assistant:

void StackInterpreter::fetchFrameData()
{
    if (!stack->getFramePointer())
    {
        // Should never reach here.
        abort();
        return;
    }

	// Decode the frame metadata.
	decodeFrameMetaData(stack->getMetadata(), this->hasContext, this->isBlock, argumentCount);

	// Get the method and the literal array
	method = stack->getMethod();
    if (method)
        literalArray = method->getFirstLiteralPointer();
    else
        literalArray = nullptr;
}